

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Performance::TextureUploadTests::init(TextureUploadTests *this,EVP_PKEY_CTX *ctx)

{
  UploadFunction uploadFunction;
  deUint32 format;
  deUint32 type;
  Context *pCVar1;
  bool bVar2;
  int extraout_EAX;
  int iVar3;
  TestNode *pTVar4;
  TestNode *pTVar5;
  long *plVar6;
  TextureUploadCase *pTVar7;
  long lVar8;
  long lVar9;
  TestCaseGroup *pTVar10;
  bool bVar11;
  long *plVar12;
  size_type *psVar13;
  long local_e8;
  string caseName;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long local_68;
  TestNode *local_60;
  TestNode *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pTVar4 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,pCVar1->m_testCtx,"upload","Texture upload");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e6f0;
  pTVar4[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar5 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pCVar1->m_testCtx,"upload_draw_swap",
             "Texture upload, draw & buffer swap");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e6f0;
  pTVar5[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  local_60 = pTVar5;
  local_58 = pTVar4;
  if (init()::textureSizes == '\0') {
    iVar3 = __cxa_guard_acquire(&init()::textureSizes);
    if (iVar3 != 0) {
      init::textureSizes[0].size = 0x10;
      pTVar10 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,pCVar1->m_testCtx,"16x16","Texture size 16x16");
      (pTVar10->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_0211e6f0;
      pTVar10->m_context = pCVar1;
      init::textureSizes[0].uploadCallGroup = pTVar10;
      pTVar10 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,pCVar1->m_testCtx,"16x16","Texture size 16x16");
      (pTVar10->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_0211e6f0;
      pTVar10->m_context = pCVar1;
      init::textureSizes[1].size = 0x100;
      init::textureSizes[0].uploadAndDrawGroup = pTVar10;
      pTVar10 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,pCVar1->m_testCtx,"256x256","Texture size 256x256");
      (pTVar10->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_0211e6f0;
      pTVar10->m_context = pCVar1;
      init::textureSizes[1].uploadCallGroup = pTVar10;
      pTVar10 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,pCVar1->m_testCtx,"256x256","Texture size 256x256");
      (pTVar10->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_0211e6f0;
      pTVar10->m_context = pCVar1;
      init::textureSizes[2].size = 0x101;
      init::textureSizes[1].uploadAndDrawGroup = pTVar10;
      pTVar10 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,pCVar1->m_testCtx,"257x257","Texture size 257x257");
      (pTVar10->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_0211e6f0;
      pTVar10->m_context = pCVar1;
      init::textureSizes[2].uploadCallGroup = pTVar10;
      pTVar10 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,pCVar1->m_testCtx,"257x257","Texture size 257x257");
      (pTVar10->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_0211e6f0;
      pTVar10->m_context = pCVar1;
      init::textureSizes[3].size = 0x400;
      init::textureSizes[2].uploadAndDrawGroup = pTVar10;
      pTVar10 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,pCVar1->m_testCtx,"1024x1024","Texture size 1024x1024");
      (pTVar10->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_0211e6f0;
      pTVar10->m_context = pCVar1;
      init::textureSizes[3].uploadCallGroup = pTVar10;
      pTVar10 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,pCVar1->m_testCtx,"1024x1024","Texture size 1024x1024");
      (pTVar10->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_0211e6f0;
      pTVar10->m_context = pCVar1;
      init::textureSizes[4].size = 0x800;
      init::textureSizes[3].uploadAndDrawGroup = pTVar10;
      pTVar10 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,pCVar1->m_testCtx,"2048x2048","Texture size 2048x2048");
      (pTVar10->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_0211e6f0;
      pTVar10->m_context = pCVar1;
      init::textureSizes[4].uploadCallGroup = pTVar10;
      pTVar10 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,pCVar1->m_testCtx,"2048x2048","Texture size 2048x2048");
      (pTVar10->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_0211e6f0;
      pTVar10->m_context = pCVar1;
      init::textureSizes[4].uploadAndDrawGroup = pTVar10;
      __cxa_guard_release(&init()::textureSizes);
    }
  }
  lVar9 = 0;
  bVar2 = true;
  do {
    bVar11 = bVar2;
    lVar8 = 0;
    do {
      local_e8 = 0;
      local_68 = lVar8;
      do {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,0x1aee929);
        plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_98 = *plVar12;
          lStack_90 = plVar6[3];
          local_a8 = &local_98;
        }
        else {
          local_98 = *plVar12;
          local_a8 = (long *)*plVar6;
        }
        local_a0 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_78 = *plVar12;
          lStack_70 = plVar6[3];
          local_88 = &local_78;
        }
        else {
          local_78 = *plVar12;
          local_88 = (long *)*plVar6;
        }
        local_80 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
        psVar13 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar13) {
          caseName.field_2._M_allocated_capacity = *psVar13;
          caseName.field_2._8_8_ = plVar6[3];
          caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
        }
        else {
          caseName.field_2._M_allocated_capacity = *psVar13;
          caseName._M_dataplus._M_p = (pointer)*plVar6;
        }
        caseName._M_string_length = plVar6[1];
        *plVar6 = (long)psVar13;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if (local_a8 != &local_98) {
          operator_delete(local_a8,local_98 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        uploadFunction = init::uploadFunctions[lVar9].func;
        format = *(deUint32 *)((long)&init::textureCombinations[0].format + local_e8);
        type = *(deUint32 *)((long)&init::textureCombinations[0].type + local_e8);
        iVar3 = init::textureSizes[lVar8].size;
        pTVar10 = init::textureSizes[lVar8].uploadCallGroup;
        pTVar7 = (TextureUploadCase *)operator_new(0x130);
        TextureUploadCase::TextureUploadCase
                  (pTVar7,(this->super_TestCaseGroup).m_context,caseName._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,uploadFunction,format,type,iVar3);
        (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TextureUploadCallCase_02129f78;
        tcu::TestNode::addChild((TestNode *)pTVar10,(TestNode *)pTVar7);
        pTVar10 = init::textureSizes[lVar8].uploadAndDrawGroup;
        pTVar7 = (TextureUploadCase *)operator_new(0x140);
        TextureUploadCase::TextureUploadCase
                  (pTVar7,(this->super_TestCaseGroup).m_context,caseName._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,uploadFunction,format,type,iVar3);
        (pTVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TextureUploadAndDrawCase_02129fb0;
        *(undefined1 *)&pTVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
        pTVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
        tcu::TestNode::addChild((TestNode *)pTVar10,(TestNode *)pTVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)caseName._M_dataplus._M_p != &caseName.field_2) {
          operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
        }
        pTVar5 = local_58;
        pTVar4 = local_60;
        local_e8 = local_e8 + 0x10;
      } while (local_e8 != 0x80);
      lVar8 = local_68 + 1;
    } while (lVar8 != 5);
    lVar9 = 1;
    bVar2 = false;
  } while (bVar11);
  lVar9 = 0;
  do {
    tcu::TestNode::addChild
              (pTVar5,*(TestNode **)((long)&init::textureSizes[0].uploadCallGroup + lVar9));
    tcu::TestNode::addChild
              (pTVar4,*(TestNode **)((long)&init::textureSizes[0].uploadAndDrawGroup + lVar9));
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0x78);
  return extraout_EAX;
}

Assistant:

void TextureUploadTests::init (void)
{
	TestCaseGroup* uploadCall		= new TestCaseGroup(m_context, "upload",			"Texture upload");
	TestCaseGroup* uploadAndDraw	= new TestCaseGroup(m_context, "upload_draw_swap",	"Texture upload, draw & buffer swap");

	addChild(uploadCall);
	addChild(uploadAndDraw);

	static const struct
	{
		const char*		name;
		const char*		nameLower;
		UploadFunction	func;
	} uploadFunctions[] =
	{
		{ "texImage2D",		"teximage2d",		UPLOAD_TEXIMAGE2D },
		{ "texSubImage2D",	"texsubimage2d",	UPLOAD_TEXSUBIMAGE2D }
	};

	static const struct
	{
		const char*	name;
		deUint32	format;
		deUint32	type;
	} textureCombinations[] =
	{
		{ "rgb_ubyte",				GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba_ubyte",				GL_RGBA,			GL_UNSIGNED_BYTE },
		{ "alpha_ubyte",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "luminance_ubyte",		GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "luminance-alpha_ubyte",	GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb_ushort565",			GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgba_ushort4444",		GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba_ushort5551",		GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
	};

	static const struct
	{
		int				size;
		TestCaseGroup*	uploadCallGroup;
		TestCaseGroup*	uploadAndDrawGroup;
	} textureSizes[] =
	{
		{ 16,	new TestCaseGroup(m_context, "16x16",		"Texture size 16x16"),		new TestCaseGroup(m_context, "16x16",		"Texture size 16x16") },
		{ 256,	new TestCaseGroup(m_context, "256x256",		"Texture size 256x256"),	new TestCaseGroup(m_context, "256x256",		"Texture size 256x256") },
		{ 257,	new TestCaseGroup(m_context, "257x257",		"Texture size 257x257"),	new TestCaseGroup(m_context, "257x257",		"Texture size 257x257") },
		{ 1024,	new TestCaseGroup(m_context, "1024x1024",	"Texture size 1024x1024"),	new TestCaseGroup(m_context, "1024x1024",	"Texture size 1024x1024") },
		{ 2048,	new TestCaseGroup(m_context, "2048x2048",	"Texture size 2048x2048"),	new TestCaseGroup(m_context, "2048x2048",	"Texture size 2048x2048") },
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	FOR_EACH(uploadFunc,	 uploadFunctions,
	FOR_EACH(texSize,		 textureSizes,
	FOR_EACH(texCombination, textureCombinations,
	{
		string			caseName	= string("") + uploadFunctions[uploadFunc].nameLower + "_" + textureCombinations[texCombination].name;
		UploadFunction	function	= uploadFunctions[uploadFunc].func;
		deUint32		format		= textureCombinations[texCombination].format;
		deUint32		type		= textureCombinations[texCombination].type;
		int				size		= textureSizes[texSize].size;

		textureSizes[texSize].uploadCallGroup->addChild		(new TextureUploadCallCase		(m_context, caseName.c_str(), "", function, format, type, size));
		textureSizes[texSize].uploadAndDrawGroup->addChild	(new TextureUploadAndDrawCase	(m_context, caseName.c_str(), "", function, format, type, size));
	})));

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(textureSizes); i++)
	{
		uploadCall->addChild	(textureSizes[i].uploadCallGroup);
		uploadAndDraw->addChild	(textureSizes[i].uploadAndDrawGroup);
	}
}